

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

void __thiscall chrono::viper::Viper::Create(Viper *this,ViperWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> *__args_3;
  shared_ptr<chrono::ChMaterialSurface> *__args_3_00;
  double *mq;
  __shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> *__r;
  int i;
  uint uVar1;
  long lVar2;
  __shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> *local_218;
  __shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2> *local_210;
  __shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  ViperWheelType local_1e4;
  ChFrame<double> local_1e0;
  __shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2> local_158;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  ChQuaternion<double> local_f8;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  __shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> local_98;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  __args_3 = &this->m_default_material;
  local_1e4 = wheel_type;
  std::
  make_shared<chrono::viper::ViperChassis,char_const(&)[8],std::shared_ptr<chrono::ChMaterialSurface>&>
            ((char (*) [8])&local_1e0,(shared_ptr<chrono::ChMaterialSurface> *)0x1847bc);
  std::__shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis).
              super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2> *)&local_1e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e0.coord);
  local_f8.m_data[0] = 0.6417999999999999;
  local_f8.m_data[1] = 0.6097999999999999;
  local_f8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)&local_f8,(ChQuaternion<double> *)&QUNIT);
  __args_3_00 = &this->m_wheel_material;
  std::
  make_shared<chrono::viper::ViperWheel,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((char (*) [9])&local_158,(ChFrame<double> *)"wheel_LF",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(ViperWheelType *)__args_3_00);
  std::__shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2> *)&this->m_wheels,
             &local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  local_f8.m_data[0] = 0.6417999999999999;
  local_f8.m_data[1] = -0.6097999999999999;
  local_f8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)&local_f8,(ChQuaternion<double> *)&QUNIT);
  std::
  make_shared<chrono::viper::ViperWheel,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((char (*) [9])&local_158,(ChFrame<double> *)"wheel_RF",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(ViperWheelType *)__args_3_00);
  std::__shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_wheels)._M_elems[1].
              super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>,&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  local_f8.m_data[0] = -0.6417999999999999;
  local_f8.m_data[1] = 0.6097999999999999;
  local_f8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)&local_f8,(ChQuaternion<double> *)&QUNIT);
  std::
  make_shared<chrono::viper::ViperWheel,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((char (*) [9])&local_158,(ChFrame<double> *)"wheel_LB",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(ViperWheelType *)__args_3_00);
  std::__shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_wheels)._M_elems[2].
              super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>,&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  local_f8.m_data[0] = -0.6417999999999999;
  local_f8.m_data[1] = -0.6097999999999999;
  local_f8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)&local_f8,(ChQuaternion<double> *)&QUNIT);
  local_210 = &local_158;
  std::
  make_shared<chrono::viper::ViperWheel,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((char (*) [9])local_210,(ChFrame<double> *)"wheel_RB",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(ViperWheelType *)__args_3_00);
  std::__shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_wheels)._M_elems[3].
              super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>,local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)&VNULL,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[0].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_mesh_xform,&local_1e0);
  mq = local_f8.m_data;
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)&VNULL,(ChQuaternion<double> *)mq);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[2].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_mesh_xform,&local_1e0);
  local_218 = (__shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> *)
              &this->m_lower_arms;
  __r = &local_98;
  local_f8.m_data[0] = 0.6417999999999999;
  local_f8.m_data[1] = 0.2067;
  local_f8.m_data[2] = -0.0525;
  local_f8.m_data[3] = 0.6417999999999999;
  uStack_d8 = 0xbfca7525460aa64c;
  uStack_d0 = 0xbfaae147ae147ae1;
  uStack_c8 = 0xbfe489a027525460;
  uStack_c0 = 0x3fca7525460aa64c;
  local_158._M_ptr = (element_type *)0x3fe489a027525460;
  local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fca7525460aa64c;
  uStack_148 = 0x3faae147ae147ae1;
  uStack_140 = 0x3fe489a027525460;
  uStack_138 = 0xbfca7525460aa64c;
  uStack_130 = 0x3faae147ae147ae1;
  uStack_128 = 0xbfe489a027525460;
  uStack_120 = 0x3fca7525460aa64c;
  local_118 = 0x3faae147ae147ae1;
  uStack_110 = 0xbfe489a027525460;
  uStack_108 = 0xbfca7525460aa64c;
  uStack_100 = 0x3faae147ae147ae1;
  local_b8 = 0xbfaae147ae147ae1;
  uStack_b0 = 0xbfe489a027525460;
  uStack_a8 = 0xbfca7525460aa64c;
  uStack_a0 = 0xbfaae147ae147ae1;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)mq,(ChQuaternion<double> *)&QUNIT);
    uVar1 = (uint)lVar2 & 1;
    local_1f8._M_ptr._0_4_ = uVar1;
    std::
    make_shared<chrono::viper::ViperLowerArm,char_const(&)[10],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              ((char (*) [10])__r,(ChFrame<double> *)"lower_arm",
               (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(int *)__args_3);
    std::__shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2>::operator=
              (local_218,__r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    ChFrame<double>::ChFrame
              (&local_1e0,(ChVector<double> *)local_210,(ChQuaternion<double> *)&QUNIT);
    local_1f8._M_ptr._0_4_ = uVar1;
    std::
    make_shared<chrono::viper::ViperUpperArm,char_const(&)[10],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              ((char (*) [10])__r,(ChFrame<double> *)"upper_arm",
               (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(int *)__args_3);
    std::__shared_ptr<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2> *)
               (local_218 + -4),
               (__shared_ptr<chrono::viper::ViperUpperArm,_(__gnu_cxx::_Lock_policy)2> *)__r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    local_210 = (__shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2> *)
                &local_210[1]._M_refcount;
    mq = mq + 3;
    local_218 = local_218 + 1;
  }
  this_00 = (__shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2> *)
            &this->m_uprights;
  local_98._M_ptr = (element_type *)0x3fe489a027525460;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe3837b4a2339c0;
  uStack_88 = 0x8000000000000000;
  uStack_80 = 0x3fe489a027525460;
  uStack_78 = 0xbfe3837b4a2339c0;
  uStack_70 = 0x8000000000000000;
  uStack_68 = 0xbfe489a027525460;
  uStack_60 = 0x3fe3837b4a2339c0;
  local_58 = 0x8000000000000000;
  uStack_50 = 0xbfe489a027525460;
  uStack_48 = 0xbfe3837b4a2339c0;
  uStack_40 = 0x8000000000000000;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    ChFrame<double>::ChFrame(&local_1e0,(ChVector<double> *)__r,(ChQuaternion<double> *)&QUNIT);
    std::
    make_shared<chrono::viper::ViperUpright,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              ((char (*) [8])&local_1f8,(ChFrame<double> *)"upright",
               (shared_ptr<chrono::ChMaterialSurface> *)&local_1e0,(int *)__args_3);
    std::__shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
    __r = (__shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> *)
          &__r[1]._M_refcount;
    this_00 = this_00 + 1;
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    std::make_shared<chrono::ChShaft>();
    std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(this->m_drive_shafts)._M_elems[0].
                       super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar2),(__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_1e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e0.coord);
  }
  return;
}

Assistant:

void Viper::Create(ViperWheelType wheel_type) {
    // create rover chassis
    m_chassis = chrono_types::make_shared<ViperChassis>("chassis", m_default_material);

    // initilize rover wheels
    double wx = 0.5618 + 0.08;
    double wy = 0.2067 + 0.32 + 0.0831;
    double wz = 0.0;

    m_wheels[V_LF] = chrono_types::make_shared<ViperWheel>("wheel_LF", ChFrame<>(ChVector<>(+wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RF] = chrono_types::make_shared<ViperWheel>("wheel_RF", ChFrame<>(ChVector<>(+wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_LB] = chrono_types::make_shared<ViperWheel>("wheel_LB", ChFrame<>(ChVector<>(-wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RB] = chrono_types::make_shared<ViperWheel>("wheel_RB", ChFrame<>(ChVector<>(-wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);

    m_wheels[V_LF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[V_LB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // create rover upper and lower suspension arms
    double cr_lx = 0.5618 + 0.08;
    double cr_ly = 0.2067;  // + 0.32/2;
    double cr_lz = 0.0525;

    ChVector<> cr_rel_pos_lower[] = {
        ChVector<>(+cr_lx, +cr_ly, -cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, -cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, -cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, -cr_lz)   // RB
    };

    ChVector<> cr_rel_pos_upper[] = {
        ChVector<>(+cr_lx, +cr_ly, cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, cr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_lower_arms[i] = chrono_types::make_shared<ViperLowerArm>("lower_arm", ChFrame<>(cr_rel_pos_lower[i], QUNIT),
                                                                   m_default_material, i % 2);
        m_upper_arms[i] = chrono_types::make_shared<ViperUpperArm>("upper_arm", ChFrame<>(cr_rel_pos_upper[i], QUNIT),
                                                                   m_default_material, i % 2);
    }

    // create uprights
    double sr_lx = 0.5618 + 0.08;
    double sr_ly = 0.2067 + 0.32 + 0.0831;
    double sr_lz = 0.0;
    ChVector<> sr_rel_pos[] = {
        ChVector<>(+sr_lx, +sr_ly, -sr_lz),  // LF
        ChVector<>(+sr_lx, -sr_ly, -sr_lz),  // RF
        ChVector<>(-sr_lx, +sr_ly, -sr_lz),  // LB
        ChVector<>(-sr_lx, -sr_ly, -sr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_uprights[i] = chrono_types::make_shared<ViperUpright>("upright", ChFrame<>(sr_rel_pos[i], QUNIT),
                                                                m_default_material, i % 2);
    }

    // create drive shafts
    for (int i = 0; i < 4; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}